

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone::xr_bone(xr_bone *this)

{
  allocator<char> local_11;
  xr_bone *local_10;
  xr_bone *this_local;
  
  this->_vptr_xr_bone = (_func_int **)&PTR__xr_bone_0038e440;
  this->m_parent = (xr_bone *)0x0;
  local_10 = this;
  std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::vector(&this->m_children);
  std::__cxx11::string::string((string *)&this->m_name);
  std::__cxx11::string::string((string *)&this->m_parent_name);
  std::__cxx11::string::string((string *)&this->m_vmap_name);
  this->m_bind_length = 0.5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_gamemtl,"default_object",&local_11);
  std::allocator<char>::~allocator(&local_11);
  s_bone_shape::s_bone_shape(&this->m_shape);
  s_joint_ik_data::s_joint_ik_data(&this->m_joint_ik_data);
  this->m_mass = 10.0;
  _vector3<float>::set(&this->m_bind_offset,0.0,0.0,0.0);
  _vector3<float>::set(&this->m_bind_rotate,0.0,0.0,0.0);
  _vector3<float>::set(&this->m_center_of_mass,0.0,0.0,0.0);
  return;
}

Assistant:

xr_bone::xr_bone(): m_parent(0),
	m_bind_length(.5f), m_gamemtl("default_object"), m_mass(10.f)
{
	m_bind_offset.set();
	m_bind_rotate.set();
	m_center_of_mass.set();
}